

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

round_direction
fmt::v6::internal::get_round_direction(uint64_t divisor,uint64_t remainder,uint64_t error)

{
  char *in_RAX;
  char *unaff_retaddr;
  round_direction rStack_10;
  
  if (divisor <= remainder) {
    assert_fail(unaff_retaddr,0,in_RAX);
  }
  if (error < divisor) {
    if (error < divisor - error) {
      if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
        if ((remainder < error) || (remainder - error < divisor - (remainder - error))) {
          rStack_10 = unknown;
        }
        else {
          rStack_10 = up;
        }
      }
      else {
        rStack_10 = down;
      }
      return rStack_10;
    }
    assert_fail(unaff_retaddr,0,in_RAX);
  }
  assert_fail(unaff_retaddr,0,in_RAX);
}

Assistant:

inline round_direction get_round_direction(uint64_t divisor, uint64_t remainder,
                                           uint64_t error) {
  FMT_ASSERT(remainder < divisor, "");  // divisor - remainder won't overflow.
  FMT_ASSERT(error < divisor, "");      // divisor - error won't overflow.
  FMT_ASSERT(error < divisor - error, "");  // error * 2 won't overflow.
  // Round down if (remainder + error) * 2 <= divisor.
  if (remainder <= divisor - remainder && error * 2 <= divisor - remainder * 2)
    return round_direction::down;
  // Round up if (remainder - error) * 2 >= divisor.
  if (remainder >= error &&
      remainder - error >= divisor - (remainder - error)) {
    return round_direction::up;
  }
  return round_direction::unknown;
}